

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsGetRuntime(JsContextRef context,JsRuntimeHandle *runtime)

{
  bool bVar1;
  JsErrorCode JVar2;
  
  JVar2 = JsErrorInvalidArgument;
  if (context != (JsContextRef)0x0) {
    if (runtime == (JsRuntimeHandle *)0x0) {
      JVar2 = JsErrorNullArgument;
    }
    else {
      *runtime = (JsRuntimeHandle)0x0;
      bVar1 = JsrtContext::Is(context);
      if (bVar1) {
        *runtime = *(JsRuntimeHandle *)((long)context + 0x10);
        JVar2 = JsNoError;
      }
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API JsGetRuntime(_In_ JsContextRef context, _Out_ JsRuntimeHandle *runtime)
{
    VALIDATE_JSREF(context);
    PARAM_NOT_NULL(runtime);

    *runtime = nullptr;

    if (!JsrtContext::Is(context))
    {
        return JsErrorInvalidArgument;
    }

    *runtime = static_cast<JsrtContext *>(context)->GetRuntime();
    return JsNoError;
}